

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  PolyType PVar1;
  uint uVar2;
  TEdge *pTVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  TEdge *pTVar7;
  uint uVar8;
  
  PVar1 = edge->PolyTyp;
  pTVar3 = edge;
  do {
    pTVar3 = pTVar3->PrevInAEL;
    if (pTVar3 == (TEdge *)0x0) {
      iVar6 = edge->WindDelta;
      if (iVar6 == 0) {
        iVar6 = (uint)((&this->m_ClipFillType)[PVar1 == ptSubject] != pftNegative) * 2 + -1;
      }
      edge->WindCnt = iVar6;
      edge->WindCnt2 = 0;
      pTVar3 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      uVar5 = 0;
      goto LAB_001160b1;
    }
  } while ((pTVar3->PolyTyp != PVar1) || (iVar6 = pTVar3->WindDelta, iVar6 == 0));
  uVar5 = edge->WindDelta;
  if ((uVar5 == 0) && (this->m_ClipType != ctUnion)) {
    edge->WindCnt = 1;
    goto LAB_001160ab;
  }
  if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
    if (uVar5 == 0) {
      bVar4 = 1;
      pTVar7 = pTVar3;
      while (pTVar7 = pTVar7->PrevInAEL, pTVar7 != (TEdge *)0x0) {
        if (pTVar7->PolyTyp == PVar1) {
          bVar4 = bVar4 ^ pTVar7->WindDelta != 0;
        }
      }
      uVar5 = (uint)(~bVar4 & 1);
    }
    edge->WindCnt = uVar5;
    goto LAB_001160ab;
  }
  uVar2 = pTVar3->WindCnt;
  if ((int)(uVar2 * iVar6) < 0) {
    uVar8 = -uVar2;
    if (0 < (int)uVar2) {
      uVar8 = uVar2;
    }
    if (1 < uVar8) goto LAB_0011607e;
    iVar6 = uVar5 + (uVar5 == 0);
  }
  else if (uVar5 == 0) {
    iVar6 = uVar2 + ((int)uVar2 >> 0x1f | 1U);
  }
  else {
LAB_0011607e:
    uVar8 = 0;
    if (-1 < (int)(iVar6 * uVar5)) {
      uVar8 = uVar5;
    }
    iVar6 = uVar2 + uVar8;
  }
  edge->WindCnt = iVar6;
LAB_001160ab:
  uVar5 = pTVar3->WindCnt2;
  edge->WindCnt2 = uVar5;
LAB_001160b1:
  pTVar3 = pTVar3->NextInAEL;
  if ((&this->m_ClipFillType)[PVar1 != ptSubject] == pftEvenOdd) {
    for (; pTVar3 != edge; pTVar3 = pTVar3->NextInAEL) {
      if (pTVar3->WindDelta != 0) {
        uVar5 = (uint)(uVar5 == 0);
        edge->WindCnt2 = uVar5;
      }
    }
  }
  else {
    for (; pTVar3 != edge; pTVar3 = pTVar3->NextInAEL) {
      uVar5 = uVar5 + pTVar3->WindDelta;
      edge->WindCnt2 = uVar5;
    }
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.PrevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while (e  && ((e->PolyTyp != edge.PolyTyp) || (e->WindDelta == 0))) e = e->PrevInAEL;
  if (!e)
  {
    if (edge.WindDelta == 0)
    {
      PolyFillType pft = (edge.PolyTyp == ptSubject ? m_SubjFillType : m_ClipFillType);
      edge.WindCnt = (pft == pftNegative ? -1 : 1);
    }
    else
      edge.WindCnt = edge.WindDelta;
    edge.WindCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc WindCnt2
  }   
  else if (edge.WindDelta == 0 && m_ClipType != ctUnion)
  {
    edge.WindCnt = 1;
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }
  else if (IsEvenOddFillType(edge))
  {
    //EvenOdd filling ...
    if (edge.WindDelta == 0)
    {
      //are we inside a subj polygon ...
      bool Inside = true;
      TEdge *e2 = e->PrevInAEL;
      while (e2)
      {
        if (e2->PolyTyp == e->PolyTyp && e2->WindDelta != 0) 
          Inside = !Inside;
        e2 = e2->PrevInAEL;
      }
      edge.WindCnt = (Inside ? 0 : 1);
    }
    else
    {
      edge.WindCnt = edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  } 
  else
  {
    //nonZero, Positive or Negative filling ...
    if (e->WindCnt * e->WindDelta < 0)
    {
      //prev edge is 'decreasing' WindCount (WC) toward zero
      //so we're outside the previous polygon ...
      if (Abs(e->WindCnt) > 1)
      {
        //outside prev poly but still inside another.
        //when reversing direction of prev poly use the same WC 
        if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
        //otherwise continue to 'decrease' WC ...
        else edge.WindCnt = e->WindCnt + edge.WindDelta;
      } 
      else
        //now outside all polys of same polytype so set own WC ...
        edge.WindCnt = (edge.WindDelta == 0 ? 1 : edge.WindDelta);
    } else
    {
      //prev edge is 'increasing' WindCount (WC) away from zero
      //so we're inside the previous polygon ...
      if (edge.WindDelta == 0) 
        edge.WindCnt = (e->WindCnt < 0 ? e->WindCnt - 1 : e->WindCnt + 1);
      //if wind direction is reversing prev then use same WC
      else if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
      //otherwise add to WC ...
      else edge.WindCnt = e->WindCnt + edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }

  //update WindCnt2 ...
  if (IsEvenOddAltFillType(edge))
  {
    //EvenOdd filling ...
    while (e != &edge)
    {
      if (e->WindDelta != 0)
        edge.WindCnt2 = (edge.WindCnt2 == 0 ? 1 : 0);
      e = e->NextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.WindCnt2 += e->WindDelta;
      e = e->NextInAEL;
    }
  }
}